

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict declaration(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  node_t pnVar2;
  int iVar3;
  node_t_conflict pnVar4;
  node *n;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  node_t_conflict op4;
  char *expected_name;
  anon_union_16_10_0af5b411_for_u *paVar7;
  pos_t pVar8;
  pos_t pVar9;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  node_t_conflict asm_part;
  node_t_conflict local_78;
  uint local_6c;
  node_t_conflict local_68;
  node_t_conflict local_60;
  pos_t pos;
  tpname_t local_48;
  
  ppVar1 = c2m_ctx->parse_ctx;
  asm_part = (node_t_conflict)0x0;
  if (*(short *)ppVar1->curr_token == 0x117) {
    pnVar4 = st_assert(c2m_ctx,no_err_p);
    return pnVar4;
  }
  iVar3 = match(c2m_ctx,0x3b,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar3 == 0) {
    try_attr_spec(c2m_ctx,ppVar1->curr_token->pos,(node_t_conflict *)0x0);
    pnVar4 = declaration_specs(c2m_ctx,no_err_p,
                               (node_t_conflict)(ulong)(ppVar1->curr_scope == c2m_ctx->top_scope));
    n = &err_struct;
    if (pnVar4 != &err_struct) {
      get_node_pos(c2m_ctx,pnVar4);
      n = new_node(c2m_ctx,N_LIST);
      if (*(short *)ppVar1->curr_token == 0x3b) {
        local_78 = new_node(c2m_ctx,N_IGNORE);
        pnVar5 = new_node(c2m_ctx,N_IGNORE);
        pnVar6 = new_node(c2m_ctx,N_IGNORE);
        op4 = new_node(c2m_ctx,N_IGNORE);
        pnVar4 = new_node5(c2m_ctx,(node_code_t)pnVar4,local_78,pnVar5,pnVar6,op4,
                           (node_t_conflict)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        op_append(c2m_ctx,n,pnVar4);
      }
      else {
        paVar7 = &pnVar4->u;
        do {
          pnVar2 = (paVar7->ops).head;
          if (pnVar2 == (node_t)0x0) break;
          paVar7 = (anon_union_16_10_0af5b411_for_u *)&(pnVar2->op_link).next;
        } while (pnVar2->code != N_TYPEDEF);
        local_6c = (uint)(pnVar2 != (node_t)0x0);
        local_68 = pnVar4;
        local_60 = n;
        do {
          pnVar4 = declarator(c2m_ctx,no_err_p);
          if (pnVar4 == &err_struct) goto LAB_00163854;
          pVar8 = get_node_pos(c2m_ctx,pnVar4);
          if (pnVar4->code != N_DECL) {
            __assert_fail("decl->code == N_DECL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1135,"node_t declaration(c2m_ctx_t, int)");
          }
          tpname_add(&local_48,c2m_ctx,(pnVar4->u).ops.head,ppVar1->curr_scope,local_6c);
          pnVar5 = try_attr_spec(c2m_ctx,pVar8,&asm_part);
          if (pnVar5 == &err_struct) {
            pnVar5 = new_node(c2m_ctx,N_IGNORE);
          }
          if (asm_part == (node_t_conflict)0x0) {
            asm_part = new_node(c2m_ctx,N_IGNORE);
          }
          iVar3 = match(c2m_ctx,0x3d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar3 == 0) {
            pnVar6 = new_node(c2m_ctx,N_IGNORE);
          }
          else {
            pnVar6 = initializer(c2m_ctx,no_err_p);
            if (pnVar6 == &err_struct) goto LAB_00163854;
          }
          pVar9 = get_node_pos(c2m_ctx,pnVar4);
          pVar8.fname = pVar9._8_8_;
          local_78 = pnVar5;
          pnVar5 = new_node1(c2m_ctx,N_SHARE,local_68);
          n = local_60;
          pVar8._8_8_ = pnVar5;
          pnVar4 = new_pos_node5(c2m_ctx,(node_code_t)pVar9.fname,pVar8,pnVar4,local_78,asm_part,
                                 pnVar6,(node_t_conflict)
                                        CONCAT44(no_err_p,in_stack_ffffffffffffff78));
          op_append(c2m_ctx,n,pnVar4);
          iVar3 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        } while (iVar3 != 0);
      }
      iVar3 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar3 == 0) {
        if (ppVar1->record_level == 0) {
          expected_name = get_token_name(c2m_ctx,0x3b);
          syntax_error(c2m_ctx,expected_name);
        }
LAB_00163854:
        n = &err_struct;
      }
    }
  }
  else {
    n = new_node(c2m_ctx,N_LIST);
    if ((ppVar1->curr_scope == c2m_ctx->top_scope) && (c2m_ctx->options->pedantic_p != 0)) {
      warning(c2m_ctx,0x18e875,pos.fname,pos._8_8_);
    }
  }
  return n;
}

Assistant:

D (declaration) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  int typedef_p;
  node_t op, list, decl, spec, r, attrs, asm_part = NULL;
  pos_t pos, last_pos;

  if (C (T_STATIC_ASSERT)) {
    P (st_assert);
  } else if (MP (';', pos)) {
    r = new_node (c2m_ctx, N_LIST);
    if (curr_scope == top_scope && c2m_options->pedantic_p)
      warning (c2m_ctx, pos, "extra ; outside of a function");
  } else {
    try_attr_spec (c2m_ctx, curr_token->pos, NULL);
    PA (declaration_specs, curr_scope == top_scope ? (node_t) 1 : NULL);
    spec = r;
    last_pos = POS (spec);
    list = new_node (c2m_ctx, N_LIST);
    if (C (';')) {
      op_append (c2m_ctx, list,
                 new_node5 (c2m_ctx, N_SPEC_DECL, spec, new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE)));
    } else { /* init-declarator-list */
      for (op = NL_HEAD (spec->u.ops); op != NULL; op = NL_NEXT (op))
        if (op->code == N_TYPEDEF) break;
      typedef_p = op != NULL;
      for (;;) { /* init-declarator */
        P (declarator);
        decl = r;
        last_pos = POS (decl);
        assert (decl->code == N_DECL);
        op = NL_HEAD (decl->u.ops);
        tpname_add (c2m_ctx, op, curr_scope, typedef_p);
        attrs = try_attr_spec (c2m_ctx, last_pos, &asm_part);
        if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
        if (asm_part == NULL) asm_part = new_node (c2m_ctx, N_IGNORE);
        if (M ('=')) {
          P (initializer);
        } else {
          r = new_node (c2m_ctx, N_IGNORE);
        }
        op_append (c2m_ctx, list,
                   new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (decl),
                                  new_node1 (c2m_ctx, N_SHARE, spec), decl, attrs, asm_part, r));
        if (!M (',')) break;
      }
    }
    r = list;
    PT (';');
  }
  return r;
}